

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall
QRasterPaintEngine::drawPixmap(QRasterPaintEngine *this,QRectF *r,QPixmap *pixmap,QRectF *sr)

{
  QPaintEngineState *pQVar1;
  bool bVar2;
  int iVar3;
  TransformationType TVar4;
  PenStyle PVar5;
  QRasterBuffer *this_00;
  QSize QVar6;
  QPaintEngineState *pQVar7;
  QPaintEngineState *pQVar8;
  QPaintEngineState *pQVar9;
  QRasterBuffer *this_01;
  QImage *__return_storage_ptr__;
  int *this_02;
  long in_FS_OFFSET;
  QColor QVar10;
  undefined1 local_d8 [32];
  QSizeF local_b8;
  qreal local_a8;
  uchar *puStack_a0;
  undefined1 local_98 [16];
  QImageData *local_88;
  QColorSpace QStack_80;
  QSizeF local_78;
  qreal local_68;
  uchar *puStack_60;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QRasterBuffer *)r;
  this_00 = (QRasterBuffer *)QPixmap::handle(pixmap);
  if (this_00->m_height == 0) {
    this_02 = &this_00->bytes_per_pixel;
    iVar3 = QImage::depth((QImage *)this_02);
    if (iVar3 != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                  (this,r,this_02,sr,0);
        return;
      }
      goto LAB_003be93a;
    }
    pQVar7 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar9 = pQVar7 + -2;
    if (pQVar7 == (QPaintEngineState *)0x0) {
      pQVar9 = (QPaintEngineState *)0x0;
    }
    TVar4 = QTransform::type((QTransform *)(pQVar9 + 0x36));
    if (1 < (int)TVar4) {
LAB_003be861:
      QVar10 = QPen::color((QPen *)(pQVar9 + 0x10));
      local_58._0_14_ = QVar10._0_14_;
      __return_storage_ptr__ = (QImage *)local_98;
      QRasterBuffer::colorizeBitmap
                (__return_storage_ptr__,this_01,(QImage *)this_02,(QColor *)local_58);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                (this,r,__return_storage_ptr__,sr,0);
      goto LAB_003be8ae;
    }
    local_58 = *(undefined1 (*) [16])&r->w;
    local_d8._0_8_ = sr->w;
    local_d8._8_8_ = sr->h;
    this_01 = (QRasterBuffer *)local_d8;
    bVar2 = qFuzzyCompare((QSizeF *)local_58,(QSizeF *)this_01);
    if (!bVar2) goto LAB_003be861;
    local_78.wd = r->w;
    local_78.ht = r->h;
    QVar6 = QPixmap::size(pixmap);
    local_98._0_8_ = (undefined8)QVar6.wd.m_i.m_i;
    local_98._8_8_ = (undefined8)QVar6.ht.m_i.m_i;
    this_01 = (QRasterBuffer *)local_98;
    bVar2 = qFuzzyCompare(&local_78,(QSizeF *)this_01);
    if (!bVar2) goto LAB_003be861;
    pQVar8 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar7 = pQVar8 + -2;
    if (pQVar8 == (QPaintEngineState *)0x0) {
      pQVar7 = (QPaintEngineState *)0x0;
    }
    if (*(long *)(pQVar7 + 0x70) == *(long *)(pQVar7 + 0x10)) {
      PVar5 = QPen::style((QPen *)(pQVar7 + 0x10));
      if (PVar5 != NoPen) {
        pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
        pQVar8 = pQVar1 + -2;
        if (pQVar1 == (QPaintEngineState *)0x0) {
          pQVar8 = (QPaintEngineState *)0x0;
        }
        if (pQVar8[0xb6].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
            super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) goto LAB_003be754;
      }
    }
    else {
LAB_003be754:
      updatePen(this,(QPen *)(pQVar7 + 0x10));
    }
    local_98._0_8_ = *(double *)(pQVar9 + 0x42) + r->xp;
    local_98._8_8_ = *(double *)(pQVar9 + 0x44) + r->yp;
    drawBitmap(this,(QPointF *)local_98,(QImage *)this_02,(QSpanData *)(pQVar9 + 0x72));
  }
  else {
    local_98 = QRectF::toAlignedRect();
    local_58 = (undefined1  [16])QPixmap::rect(pixmap);
    local_78 = (QSizeF)QRect::operator&((QRect *)local_98,(QRect *)local_58);
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x90))((QImage *)local_58,this_00,&local_78);
    local_98._0_8_ = sr->xp + (double)-local_78.wd._0_4_;
    local_98._8_8_ = sr->yp + (double)-local_78.wd._4_4_;
    local_88 = (QImageData *)sr->w;
    QStack_80.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QColorSpacePrivate>)sr->h;
    iVar3 = QImage::depth((QImage *)local_58);
    if (iVar3 == 1) {
      pQVar7 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
      pQVar9 = pQVar7 + -2;
      if (pQVar7 == (QPaintEngineState *)0x0) {
        pQVar9 = (QPaintEngineState *)0x0;
      }
      TVar4 = QTransform::type((QTransform *)(pQVar9 + 0x36));
      if ((int)TVar4 < 2) {
        local_68 = r->w;
        puStack_60 = (uchar *)r->h;
        local_a8 = sr->w;
        puStack_a0 = (uchar *)sr->h;
        this_00 = (QRasterBuffer *)&local_a8;
        bVar2 = qFuzzyCompare((QSizeF *)&local_68,(QSizeF *)this_00);
        if (bVar2) {
          local_b8.wd = r->w;
          local_b8.ht = r->h;
          QVar6 = QPixmap::size(pixmap);
          local_d8._0_8_ = (undefined8)QVar6.wd.m_i.m_i;
          local_d8._8_8_ = (undefined8)QVar6.ht.m_i.m_i;
          this_00 = (QRasterBuffer *)local_d8;
          bVar2 = qFuzzyCompare(&local_b8,(QSizeF *)this_00);
          if (!bVar2) goto LAB_003be7b7;
          pQVar8 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
          pQVar7 = pQVar8 + -2;
          if (pQVar8 == (QPaintEngineState *)0x0) {
            pQVar7 = (QPaintEngineState *)0x0;
          }
          if (*(long *)(pQVar7 + 0x70) == *(long *)(pQVar7 + 0x10)) {
            PVar5 = QPen::style((QPen *)(pQVar7 + 0x10));
            if (PVar5 != NoPen) {
              pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
              pQVar8 = pQVar1 + -2;
              if (pQVar1 == (QPaintEngineState *)0x0) {
                pQVar8 = (QPaintEngineState *)0x0;
              }
              if (pQVar8[0xb6].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) goto LAB_003be638;
            }
          }
          else {
LAB_003be638:
            updatePen(this,(QPen *)(pQVar7 + 0x10));
          }
          local_d8._0_8_ = *(double *)(pQVar9 + 0x42) + r->xp;
          local_d8._8_8_ = *(double *)(pQVar9 + 0x44) + r->yp;
          __return_storage_ptr__ = (QImage *)local_58;
          drawBitmap(this,(QPointF *)local_d8,__return_storage_ptr__,(QSpanData *)(pQVar9 + 0x72));
          goto LAB_003be8ae;
        }
      }
LAB_003be7b7:
      QVar10 = QPen::color((QPen *)(pQVar9 + 0x10));
      local_68 = QVar10._0_8_;
      puStack_60._0_6_ = QVar10.ct._4_6_;
      QRasterBuffer::colorizeBitmap
                ((QImage *)local_d8,this_00,(QImage *)local_58,(QColor *)&local_68);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                (this,r,(QImage *)local_d8,local_98,0);
      QImage::~QImage((QImage *)local_d8);
    }
    else {
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                (this,r,local_58,local_98,0);
    }
    __return_storage_ptr__ = (QImage *)local_58;
LAB_003be8ae:
    QImage::~QImage(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003be93a:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pixmap, const QRectF &sr)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawPixmap(), r=" << r << " sr=" << sr << " pixmap=" << pixmap.size() << "depth=" << pixmap.depth();
#endif

    QPlatformPixmap* pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        const QImage &image = static_cast<QRasterPlatformPixmap *>(pd)->image;
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate
                && r.size() == sr.size()
                && r.size() == pixmap.size()) {
                ensurePen();
                drawBitmap(r.topLeft() + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
                return;
            } else {
                drawImage(r, d->rasterBuffer->colorizeBitmap(image, s->pen.color()), sr);
            }
        } else {
            drawImage(r, image, sr);
        }
    } else {
        QRect clippedSource = sr.toAlignedRect().intersected(pixmap.rect());
        const QImage image = pd->toImage(clippedSource);
        QRectF translatedSource = sr.translated(-clippedSource.topLeft());
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate
                && r.size() == sr.size()
                && r.size() == pixmap.size()) {
                ensurePen();
                drawBitmap(r.topLeft() + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
                return;
            } else {
                drawImage(r, d->rasterBuffer->colorizeBitmap(image, s->pen.color()), translatedSource);
            }
        } else {
            drawImage(r, image, translatedSource);
        }
    }
}